

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::InternalSwap
          (TensorValue_RepeatedBools *this,TensorValue_RepeatedBools *other)

{
  TensorValue_RepeatedBools *other_local;
  TensorValue_RepeatedBools *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<bool>::InternalSwap(&this->values_,&other->values_);
  return;
}

Assistant:

void TensorValue_RepeatedBools::InternalSwap(TensorValue_RepeatedBools* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  values_.InternalSwap(&other->values_);
}